

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util_lite.cc
# Opt level: O2

void google::protobuf::TestUtilLite::ModifyPackedFields(TestPackedTypesLite *message)

{
  pointer piVar1;
  pointer plVar2;
  pointer puVar3;
  pointer puVar4;
  pointer pfVar5;
  pointer pdVar6;
  pointer pbVar7;
  
  piVar1 = RepeatedField<int>::Mutable(&(message->field_0)._impl_.packed_int32_,1);
  *piVar1 = 0x321;
  plVar2 = RepeatedField<long>::Mutable(&(message->field_0)._impl_.packed_int64_,1);
  *plVar2 = 0x322;
  puVar3 = RepeatedField<unsigned_int>::Mutable(&(message->field_0)._impl_.packed_uint32_,1);
  *puVar3 = 0x323;
  puVar4 = RepeatedField<unsigned_long>::Mutable(&(message->field_0)._impl_.packed_uint64_,1);
  *puVar4 = 0x324;
  piVar1 = RepeatedField<int>::Mutable(&(message->field_0)._impl_.packed_sint32_,1);
  *piVar1 = 0x325;
  plVar2 = RepeatedField<long>::Mutable(&(message->field_0)._impl_.packed_sint64_,1);
  *plVar2 = 0x326;
  puVar3 = RepeatedField<unsigned_int>::Mutable(&(message->field_0)._impl_.packed_fixed32_,1);
  *puVar3 = 0x327;
  puVar4 = RepeatedField<unsigned_long>::Mutable(&(message->field_0)._impl_.packed_fixed64_,1);
  *puVar4 = 0x328;
  piVar1 = RepeatedField<int>::Mutable(&(message->field_0)._impl_.packed_sfixed32_,1);
  *piVar1 = 0x329;
  plVar2 = RepeatedField<long>::Mutable(&(message->field_0)._impl_.packed_sfixed64_,1);
  *plVar2 = 0x32a;
  pfVar5 = RepeatedField<float>::Mutable(&(message->field_0)._impl_.packed_float_,1);
  *pfVar5 = 811.0;
  pdVar6 = RepeatedField<double>::Mutable(&(message->field_0)._impl_.packed_double_,1);
  *pdVar6 = 812.0;
  pbVar7 = RepeatedField<bool>::Mutable(&(message->field_0)._impl_.packed_bool_,1);
  *pbVar7 = true;
  proto2_unittest::TestPackedTypesLite::set_packed_enum(message,1,FOREIGN_LITE_FOO);
  return;
}

Assistant:

void TestUtilLite::ModifyPackedFields(unittest::TestPackedTypesLite* message) {
  message->set_packed_int32(1, 801);
  message->set_packed_int64(1, 802);
  message->set_packed_uint32(1, 803);
  message->set_packed_uint64(1, 804);
  message->set_packed_sint32(1, 805);
  message->set_packed_sint64(1, 806);
  message->set_packed_fixed32(1, 807);
  message->set_packed_fixed64(1, 808);
  message->set_packed_sfixed32(1, 809);
  message->set_packed_sfixed64(1, 810);
  message->set_packed_float(1, 811);
  message->set_packed_double(1, 812);
  message->set_packed_bool(1, true);
  message->set_packed_enum(1, unittest::FOREIGN_LITE_FOO);
}